

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.h
# Opt level: O0

_Bool mpack_node_bool(mpack_node_t node)

{
  mpack_error_t mVar1;
  mpack_node_t node_local;
  
  mVar1 = mpack_node_error(node);
  if (mVar1 == mpack_ok) {
    if ((node.data)->type == mpack_type_bool) {
      node_local.tree._7_1_ = (_Bool)(((node.data)->value).b & 1);
    }
    else {
      mpack_node_flag_error(node,mpack_error_type);
      node_local.tree._7_1_ = false;
    }
  }
  else {
    node_local.tree._7_1_ = false;
  }
  return node_local.tree._7_1_;
}

Assistant:

MPACK_INLINE bool mpack_node_bool(mpack_node_t node) {
    if (mpack_node_error(node) != mpack_ok)
        return false;

    if (node.data->type == mpack_type_bool)
        return node.data->value.b;

    mpack_node_flag_error(node, mpack_error_type);
    return false;
}